

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_read_at_least_error(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  cio_http_location target;
  cio_http_server_configuration config;
  cio_http_server server;
  
  cio_buffered_stream_read_at_least_fake.custom_fake = bs_read_at_least_call_fails;
  memcpy(&config,&DAT_00118b30,0xb8);
  arg1 = cio_get_inet_address_any4();
  cio_init_inet_socket_address(&config.endpoint,arg1,0x1f90);
  cVar1 = cio_http_server_init(&server,&loop,&config);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Server initialization failed!",0x36e,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_http_location_init(&target,"/foo",(void *)0x0,alloc_dummy_handler);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Request target initialization failed!",0x372,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_http_server_register_location(&server,&target);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Register request target failed!",0x375,UNITY_DISPLAY_STYLE_INT);
  split_request(
               "GET /foo HTTP/1.1\r\nContent-Length: 5\r\n\r\nHelloGET /foo HTTP/1.1\r\nContent-Length: 5\r\n\r\nHello"
               );
  cVar1 = cio_http_server_serve(&server);
  UnityAssertEqualNumber(0,(long)cVar1,"Serving http failed!",0x37d,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x37f,
             UNITY_DISPLAY_STYLE_INT);
  check_http_response(500);
  return;
}

Assistant:

static void test_read_at_least_error(void)
{
	cio_buffered_stream_read_at_least_fake.custom_fake = bs_read_at_least_call_fails;

	struct cio_http_server_configuration config = {
	    .on_error = serve_error,
	    .read_header_timeout_ns = header_read_timeout,
	    .read_body_timeout_ns = body_read_timeout,
	    .response_timeout_ns = response_timeout,
	    .close_timeout_ns = close_timeout_ns,
	    .alloc_client = alloc_dummy_client,
	    .free_client = free_dummy_client};

	cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

	struct cio_http_server server;
	enum cio_error err = cio_http_server_init(&server, &loop, &config);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

	struct cio_http_location target;
	err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");

	err = cio_http_server_register_location(&server, &target);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

	const char *request = "GET /foo HTTP/1.1" CRLF "Content-Length: 5" CRLF CRLF "Hello"
	                      "GET /foo HTTP/1.1" CRLF "Content-Length: 5" CRLF CRLF "Hello";

	split_request(request);

	err = cio_http_server_serve(&server);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

	TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");
	check_http_response(500);
}